

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

unsigned_long __thiscall cli::Parser::get<unsigned_long>(Parser *this,string *name)

{
  pointer ppCVar1;
  CmdBase *pCVar2;
  __type _Var3;
  runtime_error *prVar4;
  pointer ppCVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ppCVar5 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppCVar5 == ppCVar1) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_60,"The parameter ",name);
      std::operator+(&local_40,&local_60," could not be found.");
      std::runtime_error::runtime_error(prVar4,(string *)&local_40);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    _Var3 = std::operator==(&(*ppCVar5)->name,name);
    if (_Var3) break;
    ppCVar5 = ppCVar5 + 1;
  }
  pCVar2 = *ppCVar5;
  if ((pCVar2 != (CmdBase *)0x0) && (pCVar2->_vptr_CmdBase == (_func_int **)&PTR__CmdBase_00127b50))
  {
    return (unsigned_long)pCVar2[1]._vptr_CmdBase;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_60,"Invalid usage of the parameter ",name);
  std::operator+(&local_40,&local_60," detected.");
  std::runtime_error::runtime_error(prVar4,(string *)&local_40);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T get(const std::string& name) const {
			for (const auto& command : _commands) {
				if (command->name == name) {
					auto cmd = dynamic_cast<CmdArgument<T>*>(command);

					if (cmd == nullptr) {
						throw std::runtime_error("Invalid usage of the parameter " + name + " detected.");
					}

					return cmd->value;
				}
			}

			throw std::runtime_error("The parameter " + name + " could not be found.");
		}